

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

string * __thiscall nite::Color::str_abi_cxx11_(string *__return_storage_ptr__,Color *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  toStr_abi_cxx11_(&local_180,(nite *)this,(double)this->r);
  std::operator+(&local_a0,"(",&local_180);
  pbVar1 = &local_a0;
  std::operator+(&local_c0,pbVar1,", ");
  toStr_abi_cxx11_(&local_80,(nite *)pbVar1,(double)this->g);
  std::operator+(&local_e0,&local_c0,&local_80);
  pbVar1 = &local_e0;
  std::operator+(&local_100,pbVar1,", ");
  toStr_abi_cxx11_(&local_60,(nite *)pbVar1,(double)this->b);
  std::operator+(&local_120,&local_100,&local_60);
  pbVar1 = &local_120;
  std::operator+(&local_140,pbVar1,", ");
  toStr_abi_cxx11_(&local_40,(nite *)pbVar1,(double)this->a);
  std::operator+(&local_160,&local_140,&local_40);
  std::operator+(__return_storage_ptr__,&local_160,")");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_180);
  return __return_storage_ptr__;
}

Assistant:

String nite::Color::str(){
	return "("+toStr(r)+", "+toStr(g)+", "+toStr(b)+", "+toStr(a)+")";
}